

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

char * SimpleString::StrNCpy(char *s1,char *s2,size_t n)

{
  bool bVar1;
  char *result;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  if ((s1 != (char *)0x0) && (n != 0)) {
    *s1 = *s2;
    result = (char *)n;
    n_local = (size_t)s2;
    s2_local = s1;
    while( true ) {
      result = result + -1;
      bVar1 = false;
      if (result != (char *)0x0) {
        bVar1 = *s2_local != '\0';
      }
      if (!bVar1) break;
      s2_local[1] = *(char *)(n_local + 1);
      n_local = n_local + 1;
      s2_local = s2_local + 1;
    }
  }
  return s1;
}

Assistant:

char* SimpleString::StrNCpy(char* s1, const char* s2, size_t n)
{
    char* result = s1;

    if((NULLPTR == s1) || (0 == n)) return result;

    *s1 = *s2;
    while ((--n != 0) && *s1){
        *++s1 = *++s2;
    }
    return result;
}